

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BarrierCase::iterate(BarrierCase *this)

{
  int iVar1;
  deUint32 dVar2;
  TestLog *log_00;
  undefined4 extraout_var;
  char *pcVar3;
  ShaderProgram *this_00;
  reference pvVar4;
  size_type sVar5;
  RenderContext *context;
  Archive *archive;
  VertexArrayBinding *local_208;
  ConstPixelBufferAccess local_1a8;
  ConstPixelBufferAccess local_180;
  undefined1 local_151;
  undefined1 local_150 [7];
  bool success;
  TextureLevel reference;
  Surface rendered;
  allocator<char> local_f1;
  string local_f0;
  undefined1 *local_d0;
  undefined1 local_c8 [8];
  VertexArrayBinding attrBindings [1];
  int local_70;
  int i;
  allocator<float> local_59;
  undefined1 local_58 [8];
  vector<float,_std::allocator<float>_> attributeData;
  Functions *gl;
  undefined1 local_30 [4];
  deUint32 programGL;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  BarrierCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  pcVar3 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar3);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_30,(RenderTarget *)CONCAT44(extraout_var,iVar1),0x100,0x100,
             dVar2);
  this_00 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  dVar2 = glu::ShaderProgram::getProgram(this_00);
  attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  setViewport((Functions *)
              attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(RandomViewport *)local_30);
  (**(code **)(attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x70))(0,0,0,0x3f800000);
  (**(code **)(attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x5a0))(dVar2);
  std::allocator<float>::allocator(&local_59);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_58,0x20,&local_59);
  std::allocator<float>::~allocator(&local_59);
  for (local_70 = 0; local_70 < 0x20; local_70 = local_70 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_58,(long)local_70);
    *pvVar4 = (float)local_70 / 31.0;
  }
  (**(code **)(attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x3f6))(0x8e72,0x20);
  (**(code **)(attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x62))(0x4000);
  local_d0 = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"in_v_attr",&local_f1);
  sVar5 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_58);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_58,0);
  glu::va::Float((VertexArrayBinding *)local_c8,&local_f0,1,(int)sVar5,0,pvVar4);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::pr::Patches((PrimitiveList *)&rendered.m_pixels.m_cap,0x20);
  glu::draw(context,dVar2,1,(VertexArrayBinding *)local_c8,(PrimitiveList *)&rendered.m_pixels.m_cap
            ,(DrawUtilCallback *)0x0);
  dVar2 = (**(code **)(attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar2,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0xd9f);
  local_208 = (VertexArrayBinding *)&attrBindings[0].pointer.data;
  do {
    local_208 = local_208 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_208);
  } while (local_208 != (VertexArrayBinding *)local_c8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_58);
  getPixels((Surface *)&reference.m_data.m_cap,(RenderContext *)viewport._8_8_,
            (RandomViewport *)local_30);
  archive = tcu::TestContext::getArchive
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  getPNG((TextureLevel *)local_150,archive,&this->m_referenceImagePath);
  tcu::TextureLevel::getAccess(&local_180,(TextureLevel *)local_150);
  tcu::Surface::getAccess(&local_1a8,(Surface *)&reference.m_data.m_cap);
  local_151 = tcu::fuzzyCompare(log_00,"ImageComparison","Image Comparison",&local_180,&local_1a8,
                                0.02,COMPARE_LOG_RESULT);
  pcVar3 = "Image comparison failed";
  if ((bool)local_151) {
    pcVar3 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_151 & QP_TEST_RESULT_FAIL,pcVar3);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_150);
  tcu::Surface::~Surface((Surface *)&reference.m_data.m_cap);
  return STOP;
}

Assistant:

BarrierCase::IterateResult BarrierCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	{
		vector<float> attributeData(NUM_VERTICES);

		for (int i = 0; i < NUM_VERTICES; i++)
			attributeData[i] = (float)i / (float)(NUM_VERTICES-1);

		gl.patchParameteri(GL_PATCH_VERTICES, NUM_VERTICES);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_attr", 1, (int)attributeData.size(), 0, &attributeData[0])
		};

		glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches(NUM_VERTICES));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
		const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath);
		const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

		m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image comparison failed");
		return STOP;
	}
}